

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking::Breaking
          (Breaking *this,Flow *breaking)

{
  char *pcVar1;
  
  *(size_t *)this = (breaking->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed;
  Literal::Literal((Literal *)(this + 8),
                   (breaking->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)(this + 0x20),
             &(breaking->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
  pcVar1 = (breaking->breakTo).super_IString.str._M_str;
  *(size_t *)(this + 0x38) = (breaking->breakTo).super_IString.str._M_len;
  *(char **)(this + 0x40) = pcVar1;
  return;
}

Assistant:

Breaking(Flow breaking) : Flow(breaking) {}